

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

int stbir_resize_extended(STBIR_RESIZE *resize)

{
  void *pvVar1;
  int iVar2;
  void *p;
  stbir__info *psVar3;
  int iVar4;
  
  psVar3 = resize->samplers;
  if (psVar3 == (stbir__info *)0x0) {
    iVar4 = resize->called_alloc;
  }
  else {
    if (resize->needs_rebuild == 0) goto LAB_004492d2;
    iVar4 = resize->called_alloc;
    pvVar1 = psVar3->alloced_mem;
    if (pvVar1 != (void *)0x0) {
      psVar3->alloced_mem = (void *)0x0;
      free(pvVar1);
    }
    resize->samplers = (stbir__info *)0x0;
  }
  iVar2 = stbir_build_samplers_with_splits(resize,1);
  if (iVar2 == 0) {
    return 0;
  }
  resize->called_alloc = iVar4;
  psVar3 = resize->samplers;
  if (psVar3 == (stbir__info *)0x0) {
    return 1;
  }
LAB_004492d2:
  stbir__perform_resize(psVar3,0,resize->splits);
  if (resize->called_alloc == 0) {
    psVar3 = resize->samplers;
    if (psVar3 != (stbir__info *)0x0) {
      pvVar1 = psVar3->alloced_mem;
      if (pvVar1 != (void *)0x0) {
        psVar3->alloced_mem = (void *)0x0;
        free(pvVar1);
      }
      resize->called_alloc = 0;
    }
    resize->samplers = (stbir__info *)0x0;
  }
  return 1;
}

Assistant:

STBIRDEF int stbir_resize_extended( STBIR_RESIZE * resize )
{
  int result;

  if ( ( resize->samplers == 0 ) || ( resize->needs_rebuild ) )
  {
    int alloc_state = resize->called_alloc;  // remember allocated state

    if ( resize->samplers )
    {
      stbir__free_internal_mem( resize->samplers );
      resize->samplers = 0;
    }

    if ( !stbir_build_samplers( resize ) )
      return 0;

    resize->called_alloc = alloc_state;

    // if build_samplers succeeded (above), but there are no samplers set, then
    //   the area to stretch into was zero pixels, so don't do anything and return
    //   success
    if ( resize->samplers == 0 )
      return 1;
  }
  else
  {
    // didn't build anything - clear it
    STBIR_PROFILE_BUILD_CLEAR( resize->samplers );
  }

  // do resize
  result = stbir__perform_resize( resize->samplers, 0, resize->splits );

  // if we alloced, then free
  if ( !resize->called_alloc )
  {
    stbir_free_samplers( resize );
    resize->samplers = 0;
  }

  return result;
}